

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMapTest.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* HashMapInit_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,bool verbose)

{
  size_type sVar1;
  char cVar2;
  istream *piVar3;
  ostream *poVar4;
  int iVar5;
  uint uVar6;
  string filename;
  string line;
  ifstream wordfile;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_string_length = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&filename,"/usr/share/dict/words",(allocator *)&wordfile);
  std::ifstream::ifstream(&wordfile,filename._M_dataplus._M_p,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cout,"Unable to open words dict file ");
    poVar4 = std::operator<<(poVar4,(string *)&filename);
    std::operator<<(poVar4,"\n");
  }
  else {
    uVar6 = 0;
    iVar5 = 0;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&wordfile,(string *)&line);
      sVar1 = line._M_string_length;
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&line);
      iVar5 = iVar5 + (int)sVar1;
      uVar6 = uVar6 + 1;
    }
    std::ifstream::close();
    if (verbose) {
      printf("Read %d words from \'%s\'\n",(ulong)uVar6,filename._M_dataplus._M_p);
      printf("Avg len: %0.3f\n",(double)iVar5 / (double)(int)uVar6);
    }
  }
  std::ifstream::~ifstream(&wordfile);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&line);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> HashMapInit(bool verbose) {
  std::vector<std::string> words;
  std::string line;
  std::string filename = "/usr/share/dict/words";
  int lines = 0, sum = 0;
  std::ifstream wordfile(filename.c_str());
  if (!wordfile.is_open()) {
    std::cout << "Unable to open words dict file " << filename << "\n";
    return words;
  }
  while (getline(wordfile, line)) {
    int len = line.length();
    lines++;
    sum += len;
    words.push_back(line);
  }
  wordfile.close();
  if (verbose) {
    printf ("Read %d words from '%s'\n", lines, filename.c_str());
    printf ("Avg len: %0.3f\n", (sum+0.0)/lines);
  }
  return words;
}